

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O3

void __thiscall QtMWidgets::Stepper::setRange(Stepper *this,int min,int max)

{
  int iVar1;
  StepperPrivate *this_00;
  int iVar2;
  int iVar3;
  
  iVar2 = max;
  if (min < max) {
    iVar2 = min;
  }
  this_00 = (this->d).d;
  if (min < max) {
    min = max;
  }
  this_00->minimum = iVar2;
  this_00->maximum = min;
  iVar1 = this_00->value;
  if (iVar1 < iVar2) {
    iVar3 = iVar2;
    if (this_00->wrapping != false) {
      iVar3 = min;
    }
  }
  else {
    iVar3 = iVar1;
    if ((min < iVar1) && (iVar3 = min, this_00->wrapping != false)) {
      iVar3 = iVar2;
    }
  }
  this_00->value = iVar3;
  StepperPrivate::enableButtons(this_00);
  iVar2 = ((this->d).d)->value;
  if (iVar2 != iVar1) {
    valueChanged(this,iVar2);
    return;
  }
  return;
}

Assistant:

void
Stepper::setRange( int min, int max )
{
	d->minimum = min < max ? min : max;
	d->maximum = max < min ? min : max;

	const int oldValue = d->value;

	d->value = d->bound( d->value );

	d->enableButtons();

	if( d->value != oldValue )
		emit valueChanged( d->value );
}